

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O3

Compressor *
Imf_3_2::newTileCompressor(Compression c,size_t tileLineSize,size_t numTileLines,Header *hdr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DwaCompressor *this;
  OverflowExc *this_00;
  
  switch(c) {
  case RLE_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x28);
    if ((tileLineSize != 0) &&
       (auVar1._8_8_ = 0, auVar1._0_8_ = tileLineSize, auVar2._8_8_ = 0, auVar2._0_8_ = numTileLines
       , SUB168(auVar1 * auVar2,8) != 0)) {
      this_00 = (OverflowExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::OverflowExc::OverflowExc(this_00,"Integer multiplication overflow.");
      __cxa_throw(this_00,&Iex_3_2::OverflowExc::typeinfo,Iex_3_2::OverflowExc::~OverflowExc);
    }
    RleCompressor::RleCompressor((RleCompressor *)this,hdr,numTileLines * tileLineSize);
    break;
  case ZIPS_COMPRESSION:
  case ZIP_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x38);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case PIZ_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    PizCompressor::PizCompressor((PizCompressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case PXR24_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor((Pxr24Compressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case B44_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,tileLineSize,numTileLines,false);
    break;
  case B44A_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,tileLineSize,numTileLines,true);
    break;
  case DWAA_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor(this,hdr,(int)tileLineSize,(int)numTileLines,DEFLATE);
    break;
  case DWAB_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor(this,hdr,(int)tileLineSize,(int)numTileLines,STATIC_HUFFMAN);
    break;
  default:
    this = (DwaCompressor *)0x0;
  }
  return &this->super_Compressor;
}

Assistant:

Compressor*
newTileCompressor (
    Compression c, size_t tileLineSize, size_t numTileLines, const Header& hdr)
{
    switch (c)
    {
        case RLE_COMPRESSION:

            return new RleCompressor (hdr, uiMult (tileLineSize, numTileLines));

        case ZIPS_COMPRESSION:
        case ZIP_COMPRESSION:

            return new ZipCompressor (hdr, tileLineSize, numTileLines);

        case PIZ_COMPRESSION:

            return new PizCompressor (hdr, tileLineSize, numTileLines);

        case PXR24_COMPRESSION:

            return new Pxr24Compressor (hdr, tileLineSize, numTileLines);

        case B44_COMPRESSION:

            return new B44Compressor (hdr, tileLineSize, numTileLines, false);

        case B44A_COMPRESSION:

            return new B44Compressor (hdr, tileLineSize, numTileLines, true);

        case DWAA_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::DEFLATE);

        case DWAB_COMPRESSION:

            return new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::STATIC_HUFFMAN);

        default: return 0;
    }
}